

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V5_dimstyle.cpp
# Opt level: O2

bool __thiscall
ON_DimStyleExtra::DeleteAfterRead
          (ON_DimStyleExtra *this,ON_BinaryArchive *archive,ON_Object *parent_object)

{
  bool *pbVar1;
  double dVar2;
  undefined8 uVar3;
  int iVar4;
  unsigned_short uVar5;
  unsigned_short uVar6;
  bool bVar7;
  uint i_1;
  ON_V5x_DimStyle *this_00;
  ON_UUID *b;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  
  this_00 = ON_V5x_DimStyle::Cast(parent_object);
  if (this_00 != (ON_V5x_DimStyle *)0x0) {
    b = ON_ModelComponent::ParentId(&this_00->super_ON_ModelComponent);
    bVar7 = ::operator==(&ON_nil_uuid,b);
    if (bVar7) {
      ON_ModelComponent::SetParentId(&this_00->super_ON_ModelComponent,&this->m_parent_dimstyle);
    }
    if (this_00->m_field_override_count == 0) {
      uVar9 = (this->m_valid_fields).m_count;
      uVar8 = 0x58;
      if (uVar9 < 0x58) {
        uVar8 = (ulong)uVar9;
      }
      pbVar1 = (this->m_valid_fields).m_a;
      uVar9 = 0;
      for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
        if (uVar10 < 2) {
          this_00->m_field_override[uVar10] = false;
        }
        else {
          bVar7 = pbVar1[uVar10];
          this_00->m_field_override[uVar10] = bVar7;
          if (bVar7 == true) {
            uVar9 = uVar9 + 1;
            this_00->m_field_override_count = uVar9;
          }
        }
      }
      for (; uVar8 != 0x58; uVar8 = uVar8 + 1) {
        this_00->m_field_override[uVar8] = false;
      }
    }
    iVar4 = this->m_tolerance_resolution;
    this_00->m_tolerance_style = this->m_tolerance_style;
    this_00->m_tolerance_resolution = iVar4;
    dVar2 = this->m_tolerance_lower_value;
    this_00->m_tolerance_upper_value = this->m_tolerance_upper_value;
    this_00->m_tolerance_lower_value = dVar2;
    this_00->m_tolerance_height_scale = this->m_tolerance_height_scale;
    this_00->m_bDrawMask = this->m_bDrawMask;
    this_00->m_mask_color_source = this->m_mask_color_source;
    (this_00->m_mask_color).field_0 = (this->m_mask_color).field_0;
    this_00->m_dimscale = this->m_dimscale;
    this_00->m_dimscale_source = this->m_dimscale_source;
    uVar5 = (this->m_source_dimstyle).Data2;
    uVar6 = (this->m_source_dimstyle).Data3;
    uVar3 = *(undefined8 *)(this->m_source_dimstyle).Data4;
    (this_00->m_source_dimstyle).Data1 = (this->m_source_dimstyle).Data1;
    (this_00->m_source_dimstyle).Data2 = uVar5;
    (this_00->m_source_dimstyle).Data3 = uVar6;
    *(undefined8 *)(this_00->m_source_dimstyle).Data4 = uVar3;
  }
  return true;
}

Assistant:

bool ON_DimStyleExtra::DeleteAfterRead(
  const class ON_BinaryArchive& archive,
  class ON_Object* parent_object
) const
{
  // Move settings to ON_V5x_DimStyle
  for (;;)
  {
    ON_V5x_DimStyle* dimstyle = ON_V5x_DimStyle::Cast(parent_object);
    if (nullptr == dimstyle)
      break;

    if (ON_nil_uuid == dimstyle->ParentId())
      dimstyle->SetParentId(this->m_parent_dimstyle);

    if (0 == dimstyle->m_field_override_count)
    {
      const unsigned int capacity = sizeof(dimstyle->m_field_override) / sizeof(dimstyle->m_field_override[0]);
      unsigned int count = m_valid_fields.Count();
      if ( count > static_cast<unsigned int>(ON_V5x_DimStyle::Field::FieldCount) )
        count = static_cast<unsigned int>(ON_V5x_DimStyle::Field::FieldCount);
      for (unsigned int i = 0; i < count && i < capacity; i++)
      {
        bool bOverrideParentSetting 
          = (i > static_cast<unsigned int>(ON_V5x_DimStyle::Field::fn_index) && i <= static_cast<unsigned int>(ON_V5x_DimStyle::Field::fn_dim_arrow_blockname2) && this->m_valid_fields[i])
          ? true 
          : false;
        dimstyle->m_field_override[i] = bOverrideParentSetting;
        if (bOverrideParentSetting)
          dimstyle->m_field_override_count++;
      }
      for (unsigned int i = count; i < capacity; i++)
        dimstyle->m_field_override[i] = false;
    }
    dimstyle->m_tolerance_style = this->m_tolerance_style;
    dimstyle->m_tolerance_resolution = this->m_tolerance_resolution;
    dimstyle->m_tolerance_upper_value = this->m_tolerance_upper_value;
    dimstyle->m_tolerance_lower_value = this->m_tolerance_lower_value;
    dimstyle->m_tolerance_height_scale = this->m_tolerance_height_scale;
    dimstyle->m_bDrawMask = this->m_bDrawMask;
    dimstyle->m_mask_color_source = this->m_mask_color_source;
    dimstyle->m_mask_color = this->m_mask_color;
    dimstyle->m_dimscale = this->m_dimscale;
    dimstyle->m_dimscale_source = this->m_dimscale_source;
    dimstyle->m_source_dimstyle = this->m_source_dimstyle;
   
    break;
  }

  return true;
}